

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
* __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::
Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::iterator::operator->(iterator *this)

{
  int iVar1;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar2;
  AssertionFailure *this_00;
  
  iVar1 = (this->item_).
          super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  if ((-1 < iVar1) &&
     (pBVar2 = (this->item_).
               super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
               problem_,
     iVar1 < (int)((ulong)((long)*(pointer *)
                                  ((long)&(pBVar2->logical_cons_).
                                          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                          (long)(pBVar2->logical_cons_).
                                super__Vector_base<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
    return &this->item_;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"invalid access");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

const T *operator->() const {
        MP_ASSERT(0 <= item_.index_ &&
                  item_.index_ < T::num_items(*item_.problem_),
                  "invalid access");
        return &item_;
      }